

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_DifferentTypes_Test::TestBody
          (AnyTest_DifferentTypes_Test *this)

{
  bool bVar1;
  Any *pAVar2;
  char *pcVar3;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *matcher;
  char *in_R9;
  AssertHelper local_390;
  Message local_388;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_380;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
  local_368;
  undefined1 local_350 [8];
  AssertionResult gtest_ar;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_;
  string difference_string;
  MessageDifferencer message_differencer;
  TestAny m2;
  TestAny m1;
  ForeignMessage value2;
  undefined1 local_68 [8];
  TestField value1;
  AnyTest_DifferentTypes_Test *this_local;
  
  value1.field_0._64_8_ = this;
  proto2_unittest::TestField::TestField((TestField *)local_68);
  proto2_unittest::TestField::set_a((TestField *)local_68,0x14);
  proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)((long)&m1.field_0 + 0x30));
  proto2_unittest::ForeignMessage::set_c((ForeignMessage *)((long)&m1.field_0 + 0x30),0x1e);
  proto2_unittest::TestAny::TestAny((TestAny *)((long)&m2.field_0 + 0x30));
  proto2_unittest::TestAny::TestAny((TestAny *)&message_differencer.unpack_any_field_);
  pAVar2 = proto2_unittest::TestAny::mutable_any_value((TestAny *)((long)&m2.field_0 + 0x30));
  Any::PackFrom(pAVar2,(Message *)local_68);
  pAVar2 = proto2_unittest::TestAny::mutable_any_value
                     ((TestAny *)&message_differencer.unpack_any_field_);
  Any::PackFrom(pAVar2,(Message *)((long)&m1.field_0 + 0x30));
  util::MessageDifferencer::MessageDifferencer
            ((MessageDifferencer *)((long)&difference_string.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)((long)&difference_string.field_2 + 8),
             (string *)&gtest_ar_.message_);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)((long)&difference_string.field_2 + 8),
                     (Message *)((long)&m2.field_0 + 0x30),
                     (Message *)&message_differencer.unpack_any_field_);
  local_309 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_308,
               (AssertionResult *)"message_differencer.Compare(m1, m2)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10c6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  testing::ContainsRegex<char[81]>
            (&local_380,
             (StringLike<char[81]> *)
             "type_url: \".+/proto2_unittest.TestField\\\" -> \".+/proto2_unittest.ForeignMessage\""
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
            (&local_368,(internal *)&local_380,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(local_350,(char *)&local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "difference_string");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
  ::~PredicateFormatterFromMatcher(&local_368);
  testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>::~PolymorphicMatcher
            (&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10cb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer
            ((MessageDifferencer *)((long)&difference_string.field_2 + 8));
  proto2_unittest::TestAny::~TestAny((TestAny *)&message_differencer.unpack_any_field_);
  proto2_unittest::TestAny::~TestAny((TestAny *)((long)&m2.field_0 + 0x30));
  proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)((long)&m1.field_0 + 0x30));
  proto2_unittest::TestField::~TestField((TestField *)local_68);
  return;
}

Assistant:

TEST(AnyTest, DifferentTypes) {
  proto2_unittest::TestField value1;
  value1.set_a(20);
  proto2_unittest::ForeignMessage value2;
  value2.set_c(30);

  proto2_unittest::TestAny m1, m2;
  m1.mutable_any_value()->PackFrom(value1);
  m2.mutable_any_value()->PackFrom(value2);
  util::MessageDifferencer message_differencer;
  std::string difference_string;
  message_differencer.ReportDifferencesToString(&difference_string);
  EXPECT_FALSE(message_differencer.Compare(m1, m2));
  // Any should be treated as a regular proto when the payload types differ.
  EXPECT_THAT(
      difference_string,
      testing::ContainsRegex(
          R"(type_url: ".+/proto2_unittest.TestField\" -> ".+/proto2_unittest.ForeignMessage")"));
}